

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_StObjSlotChkUndecl
          (InterpreterStackFrame *this,Var instance,int32 slotIndex,Var value)

{
  long lVar1;
  DWORD DVar2;
  void **ppvVar3;
  Type *slotArray;
  Var value_local;
  int32 slotIndex_local;
  Var instance_local;
  InterpreterStackFrame *this_local;
  
  DVar2 = DynamicObject::GetOffsetOfAuxSlots();
  lVar1 = *(long *)((long)instance + (ulong)DVar2);
  ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)(lVar1 + (long)slotIndex * 8));
  OP_ChkUndecl(this,*ppvVar3);
  Memory::WriteBarrierPtr<void>::operator=
            ((WriteBarrierPtr<void> *)(lVar1 + (long)slotIndex * 8),value);
  return;
}

Assistant:

void InterpreterStackFrame::OP_StObjSlotChkUndecl(Var instance, int32 slotIndex, Var value)
    {
        // It would be nice to assert that it's ok to store directly to slot, but we don't have the propertyId.
        Field(Var) *slotArray = *(Field(Var)**)((char*)instance + DynamicObject::GetOffsetOfAuxSlots());
        OP_ChkUndecl(slotArray[slotIndex]);
        slotArray[slotIndex] = value;
    }